

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

bool __thiscall Gluco::Solver::litRedundant(Solver *this,Lit p,uint32_t abstract_levels)

{
  vec<Gluco::Lit> *this_00;
  int iVar1;
  int iVar2;
  Ref r;
  uint uVar3;
  char *pcVar4;
  VarData *pVVar5;
  bool bVar6;
  int j;
  long lVar7;
  uint *puVar8;
  int iVar9;
  long lVar10;
  lbool local_56;
  lbool local_55;
  uint32_t local_54;
  Lit p_1;
  Lit p_local;
  
  this_00 = &this->analyze_stack;
  if ((this->analyze_stack).data != (Lit *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  local_54 = abstract_levels;
  p_local = p;
  vec<Gluco::Lit>::push(this_00,&p_local);
  iVar1 = (this->analyze_toclear).sz;
  lVar7 = (long)iVar1;
  while( true ) {
    iVar2 = (this->analyze_stack).sz;
    if ((long)iVar2 < 1) break;
    r = (this->vardata).data[(this->analyze_stack).data[(long)iVar2 + -1].x >> 1].reason;
    if (r == 0xffffffff) {
      __assert_fail("reason(var(analyze_stack.last())) != CRef_Undef",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                    ,0x2c7,"bool Gluco::Solver::litRedundant(Lit, uint32_t)");
    }
    puVar8 = RegionAllocator<unsigned_int>::operator[]
                       (&(this->ca).super_RegionAllocator<unsigned_int>,r);
    vec<Gluco::Lit>::pop(this_00);
    if (puVar8[1] == 2) {
      local_55.value = (byte)puVar8[3] & 1 ^ (this->assigns).data[(int)puVar8[3] >> 1].value;
      bVar6 = lbool::operator==(&local_55,(lbool)0x1);
      if (bVar6) {
        local_56.value = (byte)puVar8[4] & 1 ^ (this->assigns).data[(int)puVar8[4] >> 1].value;
        bVar6 = lbool::operator==(&local_56,(lbool)0x0);
        if (!bVar6) {
          __assert_fail("value(c[1])==l_True",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                        ,0x2ca,"bool Gluco::Solver::litRedundant(Lit, uint32_t)");
        }
        *(ulong *)(puVar8 + 3) =
             CONCAT44((int)*(undefined8 *)(puVar8 + 3),
                      (int)((ulong)*(undefined8 *)(puVar8 + 3) >> 0x20));
      }
    }
    for (lVar10 = 4; lVar10 + -3 < (long)(int)puVar8[1]; lVar10 = lVar10 + 1) {
      p_1.x = puVar8[lVar10];
      iVar9 = p_1.x >> 1;
      pcVar4 = (this->seen).data;
      if (pcVar4[iVar9] == '\0') {
        pVVar5 = (this->vardata).data;
        uVar3 = pVVar5[iVar9].level;
        if (0 < (int)uVar3) {
          if ((pVVar5[iVar9].reason == 0xffffffff) || ((local_54 >> (uVar3 & 0x1f) & 1) == 0))
          goto LAB_004b62a8;
          pcVar4[iVar9] = '\x01';
          vec<Gluco::Lit>::push(this_00,&p_1);
          vec<Gluco::Lit>::push(&this->analyze_toclear,&p_1);
        }
      }
    }
  }
LAB_004b62df:
  return iVar2 < 1;
LAB_004b62a8:
  for (; iVar9 = (this->analyze_toclear).sz, lVar7 < iVar9; lVar7 = lVar7 + 1) {
    (this->seen).data[(this->analyze_toclear).data[lVar7].x >> 1] = '\0';
  }
  vec<Gluco::Lit>::shrink(&this->analyze_toclear,iVar9 - iVar1);
  goto LAB_004b62df;
}

Assistant:

bool Solver::litRedundant(Lit p, uint32_t abstract_levels)
{
    analyze_stack.clear(); analyze_stack.push(p);
    int top = analyze_toclear.size();
    while (analyze_stack.size() > 0){
        assert(reason(var(analyze_stack.last())) != CRef_Undef);
        Clause& c = ca[reason(var(analyze_stack.last()))]; analyze_stack.pop();
        if(c.size()==2 && value(c[0])==l_False) {
          assert(value(c[1])==l_True);
          Lit tmp = c[0];
          c[0] =  c[1], c[1] = tmp;
        }

        for (int i = 1; i < c.size(); i++){
            Lit p  = c[i];
            if (!seen[var(p)] && level(var(p)) > 0){
                if (reason(var(p)) != CRef_Undef && (abstractLevel(var(p)) & abstract_levels) != 0){
                    seen[var(p)] = 1;
                    analyze_stack.push(p);
                    analyze_toclear.push(p);
                }else{
                    for (int j = top; j < analyze_toclear.size(); j++)
                        seen[var(analyze_toclear[j])] = 0;
                    analyze_toclear.shrink(analyze_toclear.size() - top);
                    return false;
                }
            }
        }
    }

    return true;
}